

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

TokenInfo * __thiscall Lexer::token(Lexer *this)

{
  bool bVar1;
  bool local_a;
  bool local_9;
  
  bVar1 = hasValidToken(this);
  if (!bVar1) {
    local_9 = hasValidToken(this);
    local_a = true;
    error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                     ,&local_9,&local_a);
  }
  return (this->m_tokenPosition)._M_cur;
}

Assistant:

inline TokenInfo* token() const
	{
		ASSERT (hasValidToken());
		return &(*m_tokenPosition);
	}